

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spanning.cpp
# Opt level: O3

void get_spanning_tree(void)

{
  ulong *puVar1;
  uint uVar2;
  iterator iVar3;
  int iVar4;
  int iVar5;
  pointer pvVar6;
  ostream *poVar7;
  long *plVar8;
  uint uVar9;
  ulong uVar10;
  pointer pvVar11;
  pair<int,_std::pair<int,_int>_> *ppVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  pointer piVar16;
  int iVar17;
  pair<int,_std::pair<int,_int>_> *result;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  edges_weights;
  vector<std::pair<int,_std::pair<int,_int>_>,_std::allocator<std::pair<int,_std::pair<int,_int>_>_>_>
  results;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  used;
  uint local_d8;
  int iStack_d4;
  uint uStack_d0;
  pair<int,_std::pair<int,_int>_> *local_c8;
  iterator iStack_c0;
  pair<int,_std::pair<int,_int>_> *local_b8;
  pair<int,_std::pair<int,_int>_> *local_a8;
  iterator iStack_a0;
  pair<int,_std::pair<int,_int>_> *local_98;
  pair<int,_std::pair<int,_int>_> local_88;
  ulong local_78;
  long local_70;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  local_68;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  freopen("spanning.txt","w",_stdout);
  iVar13 = 0;
  local_b8 = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_c8 = (pair<int,_std::pair<int,_int>_> *)0x0;
  iStack_c0._M_current = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_98 = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_a8 = (pair<int,_std::pair<int,_int>_> *)0x0;
  iStack_a0._M_current = (pair<int,_std::pair<int,_int>_> *)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar17 = V;
  if (0 < V) {
    do {
      local_d8 = local_d8 & 0xffffff00;
      std::
      vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
      ::emplace_back<int&,bool>
                ((vector<std::vector<bool,std::allocator<bool>>,std::allocator<std::vector<bool,std::allocator<bool>>>>
                  *)&local_68,&V,(bool *)&local_d8);
      iVar13 = iVar13 + 1;
    } while (iVar13 < V);
    iVar17 = V;
    if (0 < V) {
      uVar10 = 0;
      local_38 = 0x800000000000003f;
      pvVar6 = edge.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        piVar16 = pvVar6[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar19 = uVar10;
        if (pvVar6[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar16) {
          local_48 = 1L << ((byte)uVar10 & 0x3f);
          local_40 = uVar10 >> 6 & 0x3ffffff;
          local_70 = uVar10 * 5;
          uVar15 = 0;
          pvVar11 = local_68.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_78 = uVar10;
          do {
            uVar2 = piVar16[uVar15];
            uVar19 = (ulong)(int)uVar2;
            uVar9 = uVar2 + 0x3f;
            if (-1 < (long)uVar19) {
              uVar9 = uVar2;
            }
            uVar18 = (ulong)((uVar19 & local_38) < 0x8000000000000001);
            if (((&(pvVar11->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)[local_70]
                 [(long)((int)uVar9 >> 6) + uVar18 + 0xffffffffffffffff] >> (uVar19 & 0x3f) & 1) ==
                0) {
              uStack_d0 = uVar2 | (uint)(local_78 >> 0x20);
              local_d8 = weight.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar10].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar15];
              iStack_d4 = (int)local_78;
              local_88.second.first = iStack_d4;
              local_88.first = local_d8;
              local_88.second.second = uVar2;
              if (iStack_c0._M_current == local_b8) {
                std::
                vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                ::_M_realloc_insert<std::pair<int,std::pair<int,int>>>
                          ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                            *)&local_c8,iStack_c0,&local_88);
              }
              else {
                ((iStack_c0._M_current)->second).second = uVar2;
                (iStack_c0._M_current)->first = local_d8;
                ((iStack_c0._M_current)->second).first = iStack_d4;
                iStack_c0._M_current = iStack_c0._M_current + 1;
              }
              puVar1 = (&((local_68.
                           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)[local_70]
                       + (long)((int)uVar9 >> 6) + uVar18 + 0xffffffffffffffff;
              *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
              puVar1 = local_68.
                       super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar19].
                       super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                       _M_start.super__Bit_iterator_base._M_p + local_40;
              *puVar1 = *puVar1 | local_48;
              pvVar6 = edge.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar11 = local_68.
                        super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            uVar15 = uVar15 + 1;
            piVar16 = pvVar6[uVar10].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar19 = local_78;
            iVar17 = V;
          } while (uVar15 < (ulong)((long)pvVar6[uVar10].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_finish - (long)piVar16 >> 2));
        }
        uVar10 = uVar19 + 1;
      } while ((long)uVar10 < (long)iVar17);
    }
  }
  iVar3._M_current = iStack_c0._M_current;
  ppVar12 = local_c8;
  if (local_c8 != iStack_c0._M_current) {
    uVar10 = ((long)iStack_c0._M_current - (long)local_c8 >> 2) * -0x5555555555555555;
    lVar14 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<int,std::pair<int,int>>>>>
              (local_c8,iStack_c0._M_current,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<int,std::pair<int,int>>*,std::vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<int,std::pair<int,int>>>>>
              (ppVar12,iVar3._M_current);
    iVar17 = V;
  }
  local_d8 = 0;
  if (0 < iVar17) {
    do {
      if (DAT_001193e0._M_current == DAT_001193e8) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&(anonymous_namespace)::p,DAT_001193e0,
                   (int *)&local_d8);
      }
      else {
        *DAT_001193e0._M_current = local_d8;
        DAT_001193e0._M_current = DAT_001193e0._M_current + 1;
      }
      local_d8 = local_d8 + 1;
    } while ((int)local_d8 < V);
  }
  if (0 < E) {
    lVar20 = 0;
    lVar14 = 0;
    do {
      iVar17 = *(int *)((long)&(local_c8->second).first + lVar20);
      iVar13 = *(int *)((long)&(local_c8->second).second + lVar20);
      iVar4 = dsu_get(iVar17);
      iVar5 = dsu_get(iVar13);
      if (iVar4 != iVar5) {
        ppVar12 = (pair<int,_std::pair<int,_int>_> *)((long)&local_c8->first + lVar20);
        if (iStack_a0._M_current == local_98) {
          std::
          vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
          ::_M_realloc_insert<std::pair<int,std::pair<int,int>>const&>
                    ((vector<std::pair<int,std::pair<int,int>>,std::allocator<std::pair<int,std::pair<int,int>>>>
                      *)&local_a8,iStack_a0,ppVar12);
        }
        else {
          ((iStack_a0._M_current)->second).second = (ppVar12->second).second;
          iVar4 = (ppVar12->second).first;
          (iStack_a0._M_current)->first = ppVar12->first;
          ((iStack_a0._M_current)->second).first = iVar4;
          iStack_a0._M_current = iStack_a0._M_current + 1;
        }
        dsu_unite(iVar17,iVar13);
      }
      iVar3._M_current = iStack_a0._M_current;
      lVar14 = lVar14 + 1;
      lVar20 = lVar20 + 0xc;
      ppVar12 = local_a8;
    } while (lVar14 < E);
    for (; ppVar12 != iVar3._M_current; ppVar12 = ppVar12 + 1) {
      poVar7 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[(ppVar12->second).first]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,id.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[(ppVar12->second).second]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      plVar8 = (long *)std::ostream::operator<<(poVar7,ppVar12->first);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
  }
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&local_68);
  if (local_a8 != (pair<int,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_a8);
  }
  if (local_c8 != (pair<int,_std::pair<int,_int>_> *)0x0) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void get_spanning_tree() {
    freopen("spanning.txt", "w", stdout); // output file

    vector < pair < int, pair<int, int> > > edges_weights, results;

    vector < vector<bool> > used;
    for (int i = 0; i < V; i++) {
        used.emplace_back(V, false);
    }

    for (int i = 0; i < V; i++) {
        for (int j = 0; j < edge[i].size(); j++) {
            int cur_v = edge[i][j];
            if (!used[i][cur_v]) {
                edges_weights.push_back(make_pair(weight[i][j], make_pair(i, cur_v)));
                used[i][cur_v] = true;
                used[cur_v][i] = true;
            }
        }
    }

    sort(edges_weights.begin(), edges_weights.end(), greater< pair < int, pair<int, int> > >());

    for (int i = 0; i < V; i++) {
        p.push_back(i);
    }

    for (int i = 0; i < E; i++) {
        int u = edges_weights[i].second.first;
        int v = edges_weights[i].second.second;
        int w = edges_weights[i].first;
        (void)w;

        if (dsu_get(u) != dsu_get(v)) {
            results.push_back(edges_weights[i]);
            dsu_unite(u, v);
        }
    }

    for (const auto& result : results) {
        cout << id[result.second.first] << " " << id[result.second.second] << " " << result.first << endl;
    }
}